

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O1

Vec_Int_t * Gia_ManCofVars(Gia_Man_t *p,int nFanLim)

{
  uint uVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(400);
  p_00->pArray = piVar2;
  uVar3 = (ulong)(uint)p->nObjs;
  if (0 < p->nObjs) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar1 = *(uint *)(&p->pObjs->field_0x0 + lVar5);
      uVar4 = ~uVar1;
      if (((uVar4 & 0x9fffffff) == 0) || (-1 < (int)uVar1 && (uVar4 & 0x1fffffff) != 0)) {
        if ((int)uVar3 <= lVar6) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (nFanLim <= p->pRefs[lVar6]) {
          Vec_IntPush(p_00,(int)lVar6);
        }
      }
      lVar6 = lVar6 + 1;
      uVar3 = (ulong)p->nObjs;
      lVar5 = lVar5 + 0xc;
    } while (lVar6 < (long)uVar3);
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManCofVars( Gia_Man_t * p, int nFanLim )
{
    Vec_Int_t * vVars;
    Gia_Obj_t * pObj;
    int i;
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p );
    vVars = Vec_IntAlloc( 100 );
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjIsCand(pObj) && Gia_ObjRefNum(p, pObj) >= nFanLim )
            Vec_IntPush( vVars, i );
    ABC_FREE( p->pRefs );
    return vVars;
}